

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_build_forward_expand(ggml_cgraph *cgraph,ggml_tensor *tensor)

{
  int iVar1;
  
  iVar1 = cgraph->n_nodes;
  ggml_visit_parents(cgraph,tensor);
  if ((iVar1 < cgraph->n_nodes) && (cgraph->nodes[(long)cgraph->n_nodes + -1] != tensor)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x16b3,"GGML_ASSERT(%s) failed","cgraph->nodes[cgraph->n_nodes - 1] == tensor");
  }
  return;
}

Assistant:

void ggml_build_forward_expand(struct ggml_cgraph * cgraph, struct ggml_tensor * tensor) {
    ggml_build_forward_impl(cgraph, tensor, true);
}